

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O2

void __thiscall
MeCab::scoped_ptr<MeCab::ContextID>::reset(scoped_ptr<MeCab::ContextID> *this,ContextID *p)

{
  ContextID *this_00;
  
  this_00 = this->ptr_;
  if (this_00 != (ContextID *)0x0) {
    ContextID::~ContextID(this_00);
  }
  operator_delete(this_00);
  this->ptr_ = p;
  return;
}

Assistant:

void reset(T * p = 0) {
    delete ptr_;
    ptr_ = p;
  }